

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::DefineGroupNode::Emit(DefineGroupNode *this,Compiler *compiler,CharCount *skipped)

{
  CompilationScheme CVar1;
  uint uVar2;
  int iVar3;
  CharCount CVar4;
  int iVar5;
  CharSet<char16_t> *other;
  code *pcVar6;
  bool bVar7;
  char16 cVar8;
  uint uVar9;
  undefined4 *puVar10;
  uint8 *puVar11;
  byte *pbVar12;
  Node *pNVar13;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  CVar1 = this->scheme;
  if (CVar1 == BeginEnd) {
    if (*skipped != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xd06,"(skipped == 0)","skipped == 0");
      if (!bVar7) {
LAB_00e9dbba:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar10 = 0;
    }
    puVar11 = Compiler::Emit(compiler,5);
    iVar5 = this->groupId;
    *puVar11 = 'A';
    *(int *)(puVar11 + 1) = iVar5;
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    puVar11 = Compiler::Emit(compiler,6);
    iVar5 = this->groupId;
    bVar7 = this->noNeedToSave;
    *puVar11 = 'B';
    *(int *)(puVar11 + 1) = iVar5;
    puVar11[5] = bVar7;
  }
  else if (CVar1 == Fixed) {
    pNVar13 = this->body;
    if ((pNVar13->thisConsumes).lower != (pNVar13->thisConsumes).upper) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xcf9,"(body->thisConsumes.IsFixed())","body->thisConsumes.IsFixed()");
      if (!bVar7) goto LAB_00e9dbba;
      *puVar10 = 0;
      pNVar13 = this->body;
    }
    (*pNVar13->_vptr_Node[0x11])(pNVar13,compiler,skipped);
    puVar11 = Compiler::Emit(compiler,10);
    iVar5 = this->groupId;
    CVar4 = (this->body->thisConsumes).lower;
    bVar7 = this->noNeedToSave;
    *puVar11 = 'C';
    *(int *)(puVar11 + 1) = iVar5;
    *(CharCount *)(puVar11 + 5) = CVar4;
    puVar11[9] = bVar7;
  }
  else if (CVar1 == Chomp) {
    pNVar13 = this->body;
    if (pNVar13->tag != Loop) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xcd9,"(body->tag == NodeTag::Loop)","body->tag == NodeTag::Loop");
      if (!bVar7) goto LAB_00e9dbba;
      *puVar10 = 0;
      pNVar13 = this->body;
    }
    other = (CharSet<char16_t> *)pNVar13[1]._vptr_Node[2];
    uVar2._0_2_ = pNVar13[1].tag;
    uVar2._2_2_ = pNVar13[1].features;
    if ((1 < uVar2) || (*(int *)&pNVar13[1].field_0xc != -1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xcdd,"(repeats.lower <= 1 && repeats.IsUnbounded())",
                         "repeats.lower <= 1 && repeats.IsUnbounded()");
      if (!bVar7) goto LAB_00e9dbba;
      *puVar10 = 0;
    }
    if ((other->rep).compact.countPlusOne != 2) {
      uVar9._0_2_ = pNVar13[1].tag;
      uVar9._2_2_ = pNVar13[1].features;
      if ((1 < uVar9) || (*(int *)&pNVar13[1].field_0xc != -1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                           ,0xce8,"(repeats.lower <= 1 && repeats.IsUnbounded())",
                           "repeats.lower <= 1 && repeats.IsUnbounded()");
        if (!bVar7) goto LAB_00e9dbba;
        *puVar10 = 0;
        uVar9._0_2_ = pNVar13[1].tag;
        uVar9._2_2_ = pNVar13[1].features;
      }
      pbVar12 = Compiler::Emit(compiler,0x2e);
      iVar5 = this->groupId;
      bVar7 = this->noNeedToSave;
      *pbVar12 = uVar9 == 0 ^ 0x59;
      RuntimeCharSet<char16_t>::RuntimeCharSet((RuntimeCharSet<char16_t> *)(pbVar12 + 1));
      *(int *)(pbVar12 + 0x29) = iVar5;
      pbVar12[0x2d] = bVar7;
      RuntimeCharSet<char16_t>::CloneFrom
                ((RuntimeCharSet<char16_t> *)(pbVar12 + 1),compiler->rtAllocator,other);
      return;
    }
    cVar8 = CharSet<char16_t>::Singleton(other);
    iVar5._0_2_ = pNVar13[1].tag;
    iVar5._2_2_ = pNVar13[1].features;
    puVar11 = Compiler::Emit(compiler,8);
    iVar3 = this->groupId;
    bVar7 = this->noNeedToSave;
    if (iVar5 == 0) {
      *puVar11 = 'V';
    }
    else {
      *puVar11 = 'W';
    }
    *(char16 *)(puVar11 + 1) = cVar8;
    *(int *)(puVar11 + 3) = iVar3;
    puVar11[7] = bVar7;
  }
  return;
}

Assistant:

void DefineGroupNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        switch (scheme)
        {
            case Chomp:
            {
                // Compilation scheme:
                //
                //   Chomp(Char|Set)Group
                Assert(body->tag == NodeTag::Loop);
                const LoopNode *const loop = static_cast<const LoopNode *>(body);
                const CharSet<Char> *const loopBodyFirstSet = loop->body->firstSet;
                const CountDomain &repeats = loop->repeats;
                Assert(repeats.lower <= 1 && repeats.IsUnbounded());
                if(loopBodyFirstSet->IsSingleton())
                {
                    const Char c = loopBodyFirstSet->Singleton();
                    if(repeats.lower == 0)
                        EMIT(compiler, ChompCharGroupInst<ChompMode::Star>, c, groupId, noNeedToSave);
                    else
                        EMIT(compiler, ChompCharGroupInst<ChompMode::Plus>, c, groupId, noNeedToSave);
                }
                else
                {
                    Assert(repeats.lower <= 1 && repeats.IsUnbounded());
                    RuntimeCharSet<Char> *runtimeSet;
                    if(repeats.lower == 0)
                        runtimeSet = &EMIT(compiler, ChompSetGroupInst<ChompMode::Star>, groupId, noNeedToSave)->set;
                    else
                        runtimeSet = &EMIT(compiler, ChompSetGroupInst<ChompMode::Plus>, groupId, noNeedToSave)->set;
                    runtimeSet->CloneFrom(compiler.rtAllocator, *loopBodyFirstSet);
                }
                break;
            }

            case Fixed:
            {
                // Compilation scheme:
                //
                //   <body>
                //   DefineGroup
                Assert(body->thisConsumes.IsFixed());
                body->Emit(compiler, skipped);
                EMIT(compiler, DefineGroupFixedInst, groupId, body->thisConsumes.lower, noNeedToSave);
                break;
            }

            case BeginEnd:
            {
                // Compilation scheme:
                //
                //   BeginDefineGroup
                //   <body>
                //   EndDefineGroup
                Assert(skipped == 0);
                EMIT(compiler, BeginDefineGroupInst, groupId);
                body->Emit(compiler, skipped);
                EMIT(compiler, EndDefineGroupInst, groupId, noNeedToSave);
                break;
            }
        }
    }